

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# log_aspect.c
# Opt level: O1

int log_aspect_detach(log_aspect aspect,log_policy policy)

{
  int iVar1;
  size_t sVar2;
  bool bVar3;
  
  if (aspect->count != 0) {
    sVar2 = 1;
    do {
      if (aspect->policies[sVar2 - 1] == policy) {
        iVar1 = log_policy_destroy(aspect->policies[sVar2 - 1]);
        memmove(aspect->policies + (sVar2 - 1),aspect->policies + sVar2,aspect->count - sVar2);
        aspect->count = aspect->count - 1;
        return iVar1;
      }
      bVar3 = sVar2 != aspect->count;
      sVar2 = sVar2 + 1;
    } while (bVar3);
  }
  return 1;
}

Assistant:

int log_aspect_detach(log_aspect aspect, log_policy policy)
{
	size_t iterator;

	for (iterator = 0; iterator < aspect->count; ++iterator)
	{
		if (policy == aspect->policies[iterator])
		{
			int result = log_policy_destroy(aspect->policies[iterator]);

			memmove(&aspect->policies[iterator], &aspect->policies[iterator + 1], aspect->count - iterator - 1);

			--aspect->count;

			return result;
		}
	}

	return 1;
}